

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O3

void __thiscall
HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo>::erase
          (HandleInfoBase<XrExportedLocalizationMapML_T_*,_GenValidUsageXrHandleInfo> *this,
          XrExportedLocalizationMapML_T *handle)

{
  iterator iVar1;
  UniqueLock lock;
  XrExportedLocalizationMapML_T *local_48;
  string local_40;
  unique_lock<std::mutex> local_20;
  
  local_48 = handle;
  if (handle == (XrExportedLocalizationMapML_T *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Null handle passed to HandleInfoBase::erase()","");
    reportInternalError(&local_40);
  }
  local_20._M_device = &this->dispatch_mutex_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  iVar1 = std::
          _Hashtable<XrExportedLocalizationMapML_T_*,_std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrExportedLocalizationMapML_T_*,_std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_48);
  if (iVar1.
      super__Node_iterator_base<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<XrExportedLocalizationMapML_T_*,_std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<XrExportedLocalizationMapML_T_*,_std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrExportedLocalizationMapML_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrExportedLocalizationMapML_T_*>,_std::hash<XrExportedLocalizationMapML_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,&local_48);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Handle passed to HandleInfoBase::insert() not inserted","");
  reportInternalError(&local_40);
}

Assistant:

inline void HandleInfoBase<HandleType, InfoType>::erase(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::erase()");
    }
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    info_map_.erase(handle);
}